

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::GrammarResolver::containsNameSpace(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar6;
  XMLCh XVar7;
  RefHashTableBucketElem<xercesc_4_0::Grammar> *pRVar8;
  long *plVar5;
  
  if (nameSpaceKey != (XMLCh *)0x0) {
    pRVar1 = this->fGrammarBucket;
    uVar4 = (ulong)(ushort)*nameSpaceKey;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      XVar7 = nameSpaceKey[1];
      if (XVar7 != L'\0') {
        pXVar6 = nameSpaceKey + 2;
        do {
          uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
          XVar7 = *pXVar6;
          pXVar6 = pXVar6 + 1;
        } while (XVar7 != L'\0');
      }
      uVar4 = uVar4 % pRVar1->fHashModulus;
    }
    pRVar8 = pRVar1->fBucketList[uVar4];
    if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar8->fKey);
        if (bVar2) {
          return true;
        }
        pRVar8 = pRVar8->fNext;
      } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
      if (bVar2) {
        return true;
      }
    }
    if (this->fUseCachedGrammar == true) {
      pRVar1 = this->fGrammarFromPool;
      uVar4 = (ulong)(ushort)*nameSpaceKey;
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        XVar7 = nameSpaceKey[1];
        if (XVar7 != L'\0') {
          pXVar6 = nameSpaceKey + 2;
          do {
            uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
            XVar7 = *pXVar6;
            pXVar6 = pXVar6 + 1;
          } while (XVar7 != L'\0');
        }
        uVar4 = uVar4 % pRVar1->fHashModulus;
      }
      pRVar8 = pRVar1->fBucketList[uVar4];
      if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
        do {
          bVar2 = StringHasher::equals
                            ((StringHasher *)&pRVar1->field_0x30,nameSpaceKey,pRVar8->fKey);
          if (bVar2) {
            return true;
          }
          pRVar8 = pRVar8->fNext;
        } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
        if (bVar2) {
          return true;
        }
      }
      iVar3 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xc])(this->fGrammarPool,nameSpaceKey);
      plVar5 = (long *)CONCAT44(extraout_var,iVar3);
      iVar3 = (*this->fGrammarPool->_vptr_XMLGrammarPool[3])(this->fGrammarPool,plVar5);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
      if (CONCAT44(extraout_var_00,iVar3) != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GrammarResolver::containsNameSpace( const XMLCh* const nameSpaceKey )
{
    if (!nameSpaceKey)
        return false;
    if (fGrammarBucket->containsKey(nameSpaceKey))
        return true;
    if (fUseCachedGrammar)
    {
        if (fGrammarFromPool->containsKey(nameSpaceKey))
            return true;

        // Lastly, need to check in fGrammarPool        
        XMLSchemaDescription* gramDesc = fGrammarPool->createSchemaDescription(nameSpaceKey);
        Janitor<XMLGrammarDescription> janName(gramDesc);
        Grammar* grammar = fGrammarPool->retrieveGrammar(gramDesc);
        if (grammar)
            return true;
    }

    return false;
}